

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O1

IndexedMatrixArray * __thiscall
stateObservation::tools::Logger::getRecord(Logger *this,void *address)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  
  p_Var3 = &(this->logs_)._M_t._M_impl.super__Rb_tree_header;
  p_Var1 = (this->logs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &p_Var3->_M_header;
  for (; p_Var1 != (_Base_ptr)0x0; p_Var1 = (&p_Var1->_M_left)[*(void **)(p_Var1 + 1) < address]) {
    if (*(void **)(p_Var1 + 1) >= address) {
      p_Var2 = p_Var1;
    }
  }
  p_Var1 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var3) && (p_Var1 = p_Var2, address < *(void **)(p_Var2 + 1)))
  {
    p_Var1 = &p_Var3->_M_header;
  }
  if ((_Rb_tree_header *)p_Var1 != p_Var3) {
    return (IndexedMatrixArray *)&p_Var1[1]._M_parent;
  }
  __assert_fail("false && \"The logger cannot find the data, please use record function\"",
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/logger.cpp"
                ,0x34,
                "const IndexedMatrixArray &stateObservation::tools::Logger::getRecord(const void *) const"
               );
}

Assistant:

const IndexedMatrixArray & Logger::getRecord(const void * address) const
{
  Tmap::const_iterator i = logs_.find(address);
  if(i == logs_.end())
  {
    BOOST_ASSERT(false && "The logger cannot find the data, please use record function");
    throw std::invalid_argument("The logger cannot find the data, please use record function");
  }
  else
    return i->second.array;
}